

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O1

void __thiscall
sptk::reaper::FdFilter::FdFilterInitialize
          (FdFilter *this,float input_freq,float corner_freq,bool do_highpass,float filter_dur,
          bool do_rate_conversion,char *spectrum_shape,float *spectrum_array,int n_magnitudes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int16_t *piVar9;
  char *pcVar10;
  float *pfVar11;
  FFT *this_00;
  long lVar12;
  long lVar13;
  undefined7 uVar14;
  undefined7 in_register_00000031;
  FILE *pFVar15;
  FdFilter *this_01;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  int n_spect;
  float fs;
  int ind;
  char line [500];
  int local_260;
  int local_25c;
  char *local_258;
  undefined8 uStack_250;
  FdFilter *local_240;
  uint local_238;
  undefined4 local_234;
  float local_230;
  undefined1 local_22c [4];
  char local_228 [504];
  
  local_240 = (FdFilter *)CONCAT44(local_240._4_4_,filter_dur);
  local_258 = (char *)CONCAT44(local_258._4_4_,corner_freq);
  this->insert_ = 1;
  this->decimate_ = 1;
  this->array_leftover_ = 0;
  this->array_index_ = 0;
  this->array_samples_used_ = 0;
  this->filter_state_ = 1;
  this->true_output_rate_ = input_freq;
  piVar9 = (int16_t *)operator_new__(44000);
  this->output_buffer_ = piVar9;
  pFVar15 = (FILE *)0x55f0;
  piVar9 = (int16_t *)operator_new__(22000);
  this->input_buffer_ = piVar9;
  uVar14 = (undefined7)((ulong)spectrum_shape >> 8);
  uVar18 = CONCAT71(uVar14,1);
  if ((spectrum_shape == (char *)0x0) &&
     (uVar18 = CONCAT71(uVar14,1 < n_magnitudes && spectrum_array != (float *)0x0),
     (1 >= n_magnitudes || spectrum_array == (float *)0x0) && !do_rate_conversion)) {
    if (input_freq * 0.5 <= local_258._0_4_) {
      pFVar15 = _stderr;
      fprintf(_stderr,"Unreasonable corner frequency specified to filter() (%f)\n");
    }
    uVar18 = 0;
  }
  local_238 = (uint)uVar18;
  if (spectrum_shape == (char *)0x0) {
    if (n_magnitudes < 2 || spectrum_array == (float *)0x0) {
      fVar20 = local_258._0_4_ / input_freq;
      if (do_rate_conversion) {
        RationalApproximation((FdFilter *)pFVar15,fVar20,&this->insert_,&this->decimate_,0xc);
        uVar1 = this->insert_;
        uVar2 = this->decimate_;
        fVar20 = (float)(int)uVar1 / (float)(int)uVar2;
        if (ABS(1.0 - fVar20) < 0.01) {
          local_258 = (char *)CONCAT44((float)(int)uVar2,fVar20);
          uStack_250 = 0;
          FdFilterInitialize();
          fVar20 = local_258._0_4_;
        }
        fVar20 = fVar20 * input_freq;
        this->true_output_rate_ = fVar20;
        fVar21 = (float)this->insert_ * input_freq;
        this->n_filter_coeffs_ = (int)(local_240._0_4_ * fVar21) | 1;
        if (input_freq <= fVar20) {
          fVar21 = (float)this->insert_;
          fVar20 = 0.5;
        }
        else {
          fVar20 = fVar20 * 0.5;
        }
        fVar20 = fVar20 / fVar21;
      }
      else {
        this->n_filter_coeffs_ = (int)(input_freq * local_240._0_4_) | 1;
      }
      local_258 = (char *)CONCAT44(local_258._4_4_,fVar20);
      this_01 = (FdFilter *)0xffffffffffffffff;
      if (-4 < this->n_filter_coeffs_) {
        this_01 = (FdFilter *)((long)(this->n_filter_coeffs_ / 2) * 4 + 4);
      }
      spectrum_array = (float *)operator_new__((ulong)this_01);
      MakeLinearFir(this_01,local_258._0_4_,&this->n_filter_coeffs_,spectrum_array);
      iVar7 = this->insert_;
      if ((1 < iVar7) && (iVar8 = this->n_filter_coeffs_, -2 < iVar8)) {
        lVar13 = (ulong)(uint)(iVar8 / 2) + 1;
        do {
          spectrum_array[lVar13 + -1] = spectrum_array[lVar13 + -1] * (float)iVar7;
          lVar12 = lVar13 + -1;
          bVar6 = 0 < lVar13;
          lVar13 = lVar12;
        } while (lVar12 != 0 && bVar6);
      }
      bVar6 = false;
    }
    else {
      this->n_filter_coeffs_ = n_magnitudes + -1;
      local_25c = 0;
      do {
        local_25c = local_25c + 1;
      } while (1 << ((byte)local_25c & 0x1f) < n_magnitudes * 2 + -2);
      bVar6 = true;
    }
  }
  else {
    local_258 = spectrum_shape;
    pFVar15 = fopen(spectrum_shape,"r");
    if (pFVar15 == (FILE *)0x0) {
      bVar6 = false;
      fprintf(_stderr,"Can\'t open %s as a spectrum file\n",local_258);
      spectrum_array = (float *)0x0;
    }
    else {
      pcVar10 = fgets(local_228,500,pFVar15);
      if (pcVar10 == (char *)0x0) {
        spectrum_array = (float *)0x0;
        fprintf(_stderr,"Bad format in spectrum file %s\n",local_258);
      }
      else {
        local_240 = this;
        iVar7 = __isoc99_sscanf(local_228,"%d %d %f",&local_25c,&local_260,&local_230);
        if ((iVar7 == 3) && ((local_230 != input_freq || (NAN(local_230) || NAN(input_freq))))) {
          FdFilterInitialize();
        }
        iVar7 = local_260;
        uVar19 = 0xffffffffffffffff;
        if (-1 < (long)local_260) {
          uVar19 = (long)local_260 * 4;
        }
        spectrum_array = (float *)operator_new__(uVar19);
        local_240->n_filter_coeffs_ = iVar7 + -1;
        this = local_240;
        if (0 < local_260) {
          lVar13 = 0;
          pfVar11 = spectrum_array;
          local_234 = (int)CONCAT71(in_register_00000031,do_highpass);
          do {
            pcVar10 = fgets(local_228,500,pFVar15);
            if ((pcVar10 == (char *)0x0) ||
               (iVar7 = __isoc99_sscanf(local_228,"%d %f",local_22c,pfVar11), iVar7 != 2)) {
              fprintf(_stderr,"Parsing error in spect ratio file %s\n",local_258);
            }
            lVar13 = lVar13 + 1;
            pfVar11 = pfVar11 + 1;
          } while (lVar13 < local_260);
          uVar18 = (ulong)local_238;
          do_highpass = SUB41(local_234,0);
          this = local_240;
        }
      }
      fclose(pFVar15);
      bVar6 = false;
    }
  }
  this->n_filter_coeffs_by2_ = this->n_filter_coeffs_ / 2;
  if ((char)uVar18 == '\0') {
    MirrorFilter(this,spectrum_array,do_highpass);
    iVar7 = this->n_filter_coeffs_ * 2;
    this->fft_size_ = 0x80;
    local_25c = 7;
    if (0x80 < iVar7) {
      iVar8 = 0x80;
      do {
        iVar17 = iVar8 * 2;
        local_25c = local_25c + 1;
        iVar16 = iVar8 * -2;
        iVar8 = iVar17;
      } while (iVar7 != iVar17 && SBORROW4(iVar7,iVar17) == iVar7 + iVar16 < 0);
      this->fft_size_ = iVar17;
    }
  }
  else {
    iVar7 = this->n_filter_coeffs_ * 2;
    this->fft_size_ = iVar7;
    local_25c = 1;
    do {
      local_25c = local_25c + 1;
    } while (1 << ((byte)local_25c & 0x1f) < iVar7);
  }
  iVar7 = this->fft_size_;
  lVar13 = (long)iVar7;
  this->fft_size_by2_ = iVar7 / 2;
  uVar18 = lVar13 * 4;
  if (lVar13 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  uVar19 = lVar13 * 2;
  if (lVar13 < 0) {
    uVar19 = 0xffffffffffffffff;
  }
  pfVar11 = (float *)operator_new__(uVar18);
  this->x_ = pfVar11;
  pfVar11 = (float *)operator_new__(uVar18);
  this->y_ = pfVar11;
  pfVar11 = (float *)operator_new__(uVar18);
  this->xf_ = pfVar11;
  pfVar11 = (float *)operator_new__(uVar18);
  this->yf_ = pfVar11;
  piVar9 = (int16_t *)operator_new__(uVar19);
  this->leftovers_ = piVar9;
  this->max_input_ = (int)(11000 / (long)this->insert_);
  iVar8 = this->n_filter_coeffs_ + iVar7 + 22000;
  uVar18 = (long)iVar8 * 4;
  if (iVar8 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  pfVar11 = (float *)operator_new__(uVar18);
  this->output_delayed_ = pfVar11;
  this_00 = (FFT *)operator_new(0x20);
  FFT::FFT(this_00,local_25c);
  fVar20 = 1.0 / (float)iVar7;
  this->fft_ = this_00;
  if ((char)local_238 == '\0') {
    uVar3 = this->n_filter_coeffs_by2_;
    if ((int)uVar3 < 0) {
      lVar13 = 0;
    }
    else {
      pfVar11 = this->xf_;
      pfVar4 = this->yf_;
      pfVar5 = this->filter_coeffs_;
      lVar13 = 0;
      do {
        pfVar11[lVar13] = pfVar5[(ulong)uVar3 + lVar13] * fVar20;
        pfVar4[lVar13] = 0.0;
        lVar13 = lVar13 + 1;
      } while ((ulong)uVar3 + 1 != lVar13);
    }
    iVar7 = this->n_filter_coeffs_;
    iVar8 = (int)lVar13;
    if (iVar8 < iVar7) {
      pfVar11 = this->filter_coeffs_;
      pfVar4 = this->xf_;
      pfVar5 = this->yf_;
      iVar16 = (this->fft_size_ + iVar8) - iVar7;
      iVar17 = ~uVar3 + iVar8;
      lVar13 = (long)iVar7 - (long)iVar8;
      do {
        pfVar4[iVar16] = pfVar11[iVar17] * fVar20;
        pfVar5[iVar16] = 0.0;
        iVar16 = iVar16 + 1;
        iVar17 = iVar17 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    iVar7 = this->fft_size_;
    if ((int)uVar3 < (int)(iVar7 - uVar3)) {
      lVar13 = (long)(int)uVar3;
      pfVar11 = this->yf_;
      pfVar4 = this->xf_;
      lVar12 = 0;
      do {
        pfVar11[lVar13 + lVar12] = 0.0;
        pfVar4[lVar13 + lVar12] = 0.0;
        lVar12 = lVar12 + 1;
      } while ((long)iVar7 + lVar13 * -2 != lVar12);
    }
    FFT::fft(this_00,this->xf_,this->yf_);
  }
  else {
    uVar3 = this->n_filter_coeffs_;
    if ((int)uVar3 < 0) {
      lVar13 = 0;
    }
    else {
      pfVar11 = this->xf_;
      pfVar4 = this->yf_;
      lVar13 = 0;
      do {
        pfVar11[lVar13] = spectrum_array[lVar13] * fVar20;
        pfVar4[lVar13] = 0.0;
        lVar13 = lVar13 + 1;
      } while ((ulong)uVar3 + 1 != lVar13);
    }
    if ((int)lVar13 < this->fft_size_) {
      pfVar11 = this->xf_;
      pfVar4 = this->yf_;
      lVar13 = (long)(int)lVar13;
      lVar12 = this->fft_size_ - lVar13;
      do {
        pfVar11[lVar13] = pfVar11[lVar12];
        pfVar4[lVar13] = 0.0;
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
  }
  if (!bVar6 && spectrum_array != (float *)0x0) {
    operator_delete__(spectrum_array);
  }
  return;
}

Assistant:

void FdFilter::FdFilterInitialize(float input_freq, float corner_freq,
                                  bool do_highpass, float filter_dur,
                                  bool do_rate_conversion,
                                  char *spectrum_shape, float *spectrum_array,
                                  int n_magnitudes) {
  float beta = 0.0, *b = NULL;
  float  ratio_t, ratio, freq1 = input_freq;
  int pow2, i;
  bool do_eq_filtering = false;
  bool b_allocated = true;

  insert_ = 1;
  decimate_ = 1;
  filter_state_ = 1;
  array_leftover_ = 0;
  array_index_ = 0;
  array_samples_used_ = 0;
  true_output_rate_ = input_freq;

  output_buffer_ = new int16_t[kIoBufferSize * 2];
  input_buffer_ = new int16_t[kIoBufferSize];

  if (spectrum_shape || (spectrum_array && (n_magnitudes > 1))) {
    do_eq_filtering = true;
  } else {
    if (do_rate_conversion) {
      freq1 = input_freq;
    } else {   /* it is just a symmetric FIR */
      if (corner_freq >= (freq1 = input_freq) / 2.0) {
        fprintf(stderr,
                "Unreasonable corner frequency specified to filter() (%f)\n",
                corner_freq);
      }
    }
  }

  if (spectrum_shape) {
    FILE *spec_stream = fopen(spectrum_shape, "r");
    if (spec_stream) {
      int n_spect, ind;
      char line[500];
      float fs;
      if (fgets(line, 500, spec_stream)) {
        int nItems = sscanf(line, "%d %d %f", &pow2, &n_spect, &fs);
        if ((nItems == 3) && (fs != input_freq)) {  // This should be a
                                                  // fatal error!
          fprintf(stderr,
                  "Filter spec (%f) does not match input frequency (%f)\n",
                  fs, input_freq);
          fprintf(stderr,
               "The filtering results will probably not be what you want!\n");
        }
        b = new float[n_spect];
        n_filter_coeffs_ = n_spect - 1;  // n_filter_coeffs_ represents actual
                                         // filter-kernel length,
                                         // instead of half filter
                                         // length when using external
                                         // filter.
        for (i = 0; i < n_spect; i++) {
          if ((!fgets(line, 500, spec_stream)) ||
             (sscanf(line, "%d %f", &ind, &(b[i])) != 2)) {
            fprintf(stderr, "Parsing error in spect ratio file %s\n",
                    spectrum_shape);
          }
        }
      } else {
        fprintf(stderr, "Bad format in spectrum file %s\n",
                             spectrum_shape);
      }
      fclose(spec_stream);
    } else {
      fprintf(stderr, "Can't open %s as a spectrum file\n",
                           spectrum_shape);
    }
  } else {
    // Note: n_magnitudes MUST be ((2^k)+1) for k > 1.
    if (spectrum_array && (n_magnitudes > 1)) {
      n_filter_coeffs_ = n_magnitudes - 1;
      int nft = n_filter_coeffs_ * 2;
      pow2 = 1;
      while ((1 << pow2) < nft) {
        pow2++;
      }
      b = spectrum_array;  // Note: b must not be deleted in this case!
      b_allocated = false;
    } else { /* it is not an eq filter */
      if (do_rate_conversion) {
        /* get a ratio of integers close to desired freq. ratio. */
        ratio = corner_freq/freq1;
        RationalApproximation(ratio, &insert_, &decimate_, kMaxDecimation);
        ratio_t = static_cast<float>(insert_) / decimate_;

        if (fabs(1.0 - ratio_t) < .01) {
          fprintf(stderr,
                  "Input and output frequencies are essentially equal!\n");
        }
        true_output_rate_ = ratio_t * freq1;
        // if (corner_freq != true_output_rate_) {
        //   fprintf(stderr,
        // "Warning: Output frequency obtained(%f) is not as requested(%f)\n",
        //    true_output_rate_, corner_freq);
        // }
        corner_freq = true_output_rate_;
        n_filter_coeffs_ = static_cast<int>(freq1 * insert_ * filter_dur) | 1;
        if (corner_freq < freq1)
          beta = (.5 * corner_freq)/(insert_ * freq1);
        else
          beta = .5/insert_;
      } else {
        beta = corner_freq/freq1;
        n_filter_coeffs_ = static_cast<int>(freq1 * filter_dur) | 1;
      }

      /* Generate the symmetric FIR filter coefficients. */
      b = new float[1 + (n_filter_coeffs_ / 2)];
      MakeLinearFir(beta, &n_filter_coeffs_, b);

      if (insert_ > 1) {  // Scale up filter coeffs. to maintain
                        // precision in output.
        float fact = insert_;
        for (i = n_filter_coeffs_ / 2; i >= 0; i--) b[i] *= fact;
      }
    }  // end else it is not an eq filter.
  }  // end else (a spectrum shape was not specified).

  n_filter_coeffs_by2_ = n_filter_coeffs_ / 2;

  if (!do_eq_filtering) { /* Is it a simple high- or low-pass filter? */
    MirrorFilter(b, do_highpass);
    int nf2 = n_filter_coeffs_ << 1;
    fft_size_ = 128;
    pow2 = 7;
    while (nf2 > fft_size_) {
      fft_size_ *= 2;
      pow2++;
    }
  } else {  // It is a filter with the magnitude response specified in b.
    fft_size_ = n_filter_coeffs_ * 2;
    pow2 = 2;
    while ((1 << pow2) < fft_size_)
      pow2++;
  }

  fft_size_by2_ = fft_size_ / 2;

  x_ = new float[fft_size_];
  y_ = new float[fft_size_];
  xf_ = new float[fft_size_];
  yf_ = new float[fft_size_];

  leftovers_ = new int16_t[fft_size_];
  max_input_ = kIoBufferSize / insert_;
  output_delayed_ = new float[(2 * kIoBufferSize)+n_filter_coeffs_+fft_size_];

  float ftscale = 1.0 / fft_size_;
  fft_ = new FFT(pow2);
  if (!do_eq_filtering) {
    // position the filter kernel to be symmetric about time=0
    // Note that this assumes an odd number of symmetric filter coefficients.
    for (i = 0; i <= n_filter_coeffs_by2_; i++) {
      xf_[i] = ftscale * filter_coeffs_[i+n_filter_coeffs_by2_];
      yf_[i] = 0.0;
    }
    for (; i < n_filter_coeffs_; i++) {
      xf_[fft_size_ - n_filter_coeffs_ + i] = ftscale *
           filter_coeffs_[i - n_filter_coeffs_by2_ - 1];
      yf_[fft_size_ - n_filter_coeffs_ + i] = 0.0;
    }
    for (i = n_filter_coeffs_by2_; i < (fft_size_-n_filter_coeffs_by2_); i++)
      xf_[i] = yf_[i] = 0.0;
    fft_->fft(xf_, yf_);
  } else { /* Install the magnitude response symmetrically. */
    for (i = 0; i <= n_filter_coeffs_; i++) {
      xf_[i] = ftscale * b[i];
      yf_[i] = 0.0;
    }
    for (; i < fft_size_; i++) {
      xf_[i] = xf_[fft_size_ - i];
      yf_[i] = 0.0;
    }
  }
  /* The filter, regardless of its origin, is now in the frequency domain. */

  if (b_allocated) {
    delete [] b;
  }
}